

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O1

void __thiscall
OpenMD::VectorAccumulator::get95percentConfidenceInterval(VectorAccumulator *this,ResultType *ret)

{
  size_t sVar1;
  double dVar2;
  double dVar3;
  ResultType sd;
  ResultType local_38;
  
  local_38.super_Vector<double,_3U>.data_[0] = 0.0;
  local_38.super_Vector<double,_3U>.data_[1] = 0.0;
  local_38.super_Vector<double,_3U>.data_[2] = 0.0;
  getStdDev(this,&local_38);
  dVar3 = local_38.super_Vector<double,_3U>.data_[0] * 1.96;
  sVar1 = (this->super_BaseAccumulator).Count_;
  dVar2 = ((double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0);
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  (ret->super_Vector<double,_3U>).data_[0] = dVar3 / dVar2;
  dVar3 = local_38.super_Vector<double,_3U>.data_[1] * 1.96;
  sVar1 = (this->super_BaseAccumulator).Count_;
  dVar2 = ((double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0);
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  (ret->super_Vector<double,_3U>).data_[1] = dVar3 / dVar2;
  dVar3 = local_38.super_Vector<double,_3U>.data_[2] * 1.96;
  sVar1 = (this->super_BaseAccumulator).Count_;
  dVar2 = ((double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0);
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  (ret->super_Vector<double,_3U>).data_[2] = dVar3 / dVar2;
  return;
}

Assistant:

void get95percentConfidenceInterval(ResultType& ret) {
      assert(Count_ != 0);
      ResultType sd;
      this->getStdDev(sd);
      ret[0] = 1.960 * sd[0] / sqrt(RealType(Count_));
      ret[1] = 1.960 * sd[1] / sqrt(RealType(Count_));
      ret[2] = 1.960 * sd[2] / sqrt(RealType(Count_));
      return;
    }